

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::SetRecyclerProfiler(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xc74,
                                "(Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))",
                                "Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag)");
    if (!bVar2) goto LAB_007981b4;
    *puVar3 = 0;
  }
  if (this->profiler == (ScriptContextProfiler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xc75,"(this->profiler != nullptr)",
                                "Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar2) {
LAB_007981b4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->ensureParentInfo == true) {
    (*this->hostScriptContext->_vptr_HostScriptContext[0x19])(this->hostScriptContext,0);
    this->ensureParentInfo = false;
  }
  Memory::Recycler::SetProfiler
            (this->recycler,this->profiler->profiler,this->profiler->backgroundRecyclerProfiler);
  return;
}

Assistant:

void
        ScriptContext::SetRecyclerProfiler()
    {
            Assert(Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag));
            AssertMsg(this->profiler != nullptr, "Profiler tag is supplied but the profiler pointer is NULL");

            if (this->ensureParentInfo)
            {
                this->hostScriptContext->EnsureParentInfo();
                this->ensureParentInfo = false;
            }

            this->GetRecycler()->SetProfiler(this->profiler->GetProfiler(), this->profiler->GetBackgroundRecyclerProfiler());
    }